

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeWriter.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsByteCodeWriter::TryWriteFloat32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (AsmJsByteCodeWriter *this,OpCodeAsmJs op,RegSlot R0,int C1,int C2,int C3,int C4)

{
  bool bVar1;
  undefined1 local_19;
  int local_18;
  undefined1 auStack_14 [3];
  OpLayoutT_Float32x4_IntConst4<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if (((DAT_0143bfdd == '\0') && (DAT_0143bfdc == '\0')) && (local_19 = (undefined1)R0, R0 < 0x100))
  {
    layout.C2 = C4;
    local_18 = C1;
    _auStack_14 = C2;
    layout.C1 = C3;
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)0>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_19,0x11,
               &this->super_ByteCodeWriter,false);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool AsmJsByteCodeWriter::TryWriteFloat32x4_IntConst4(OpCodeAsmJs op, RegSlot R0, int C1, int C2, int C3, int C4)
    {
        OpLayoutT_Float32x4_IntConst4<SizePolicy> layout;
        if (SizePolicy::Assign(layout.F4_0, R0) && 
            SizePolicy::Assign(layout.C1, C1) && 
            SizePolicy::Assign(layout.C2, C2) &&
            SizePolicy::Assign(layout.C3, C3) &&
            SizePolicy::Assign(layout.C4, C4)
            )
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }